

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::ServiceDescriptorProto>
          (Generator *this,ServiceDescriptorProto *descriptor_proto,string_view name)

{
  Printer *this_00;
  string *psVar1;
  LogMessage *pLVar2;
  long lVar3;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum local_148;
  string local_118;
  AlphaNum local_f8;
  string local_c8;
  string_view local_a8;
  undefined1 local_98 [16];
  LogMessageFatal local_88 [19];
  Voidify local_75;
  int local_74;
  unsigned_long local_70;
  string *local_68;
  string *absl_log_internal_check_op_result;
  size_t offset;
  string local_48 [8];
  string sp;
  ServiceDescriptorProto *descriptor_proto_local;
  Generator *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Generator *)name._M_len;
  sp.field_2._8_8_ = descriptor_proto;
  std::__cxx11::string::string(local_48);
  google::protobuf::MessageLite::SerializeToString((string *)sp.field_2._8_8_);
  absl_log_internal_check_op_result =
       (string *)
       std::__cxx11::string::find((string *)&this->file_descriptor_serialized_,(ulong)local_48);
  local_70 = absl::lts_20240722::log_internal::GetReferenceableValue
                       ((unsigned_long)absl_log_internal_check_op_result);
  local_74 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_68 = absl::lts_20240722::log_internal::Check_GEImpl<unsigned_long,int>
                       (&local_70,&local_74,"offset >= 0");
  if (local_68 != (string *)0x0) {
    local_98 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
               ,0x51d,local_98._0_8_,local_98._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_88);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_75,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
  }
  this_00 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a8,
             "_globals[\'$name$\']._serialized_start=$serialized_start$\n_globals[\'$name$\']._serialized_end=$serialized_end$\n"
            );
  absl::lts_20240722::AlphaNum::AlphaNum(&local_f8,(unsigned_long)absl_log_internal_check_op_result)
  ;
  absl::lts_20240722::StrCat_abi_cxx11_(&local_c8,(lts_20240722 *)&local_f8,a);
  psVar1 = absl_log_internal_check_op_result;
  lVar3 = std::__cxx11::string::size();
  absl::lts_20240722::AlphaNum::AlphaNum(&local_148,(unsigned_long)(&psVar1->_M_dataplus + lVar3));
  absl::lts_20240722::StrCat_abi_cxx11_(&local_118,(lts_20240722 *)&local_148,a_00);
  io::Printer::
  Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,local_a8,(char (*) [5])0x6b980f,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (char (*) [17])"serialized_start",&local_c8,(char (*) [15])"serialized_end",&local_118)
  ;
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(
    const DescriptorProtoT& descriptor_proto, absl::string_view name) const {
  std::string sp;
  descriptor_proto.SerializeToString(&sp);
  size_t offset = file_descriptor_serialized_.find(sp);
  ABSL_CHECK_GE(offset, 0);

  printer_->Print(
      "_globals['$name$']._serialized_start=$serialized_start$\n"
      "_globals['$name$']._serialized_end=$serialized_end$\n",
      "name", name, "serialized_start", absl::StrCat(offset), "serialized_end",
      absl::StrCat(offset + sp.size()));
}